

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O2

void __thiscall
chrono::robosimian::RS_Limb::Activate(RS_Limb *this,double time,array<double,_8UL> *vals)

{
  mapped_type *pmVar1;
  long lVar2;
  undefined1 *__k;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  shared_ptr<chrono::ChFunction_Setpoint> fun;
  shared_ptr<chrono::ChFunction> local_50;
  __shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  __k = motor_names_abi_cxx11_;
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    pmVar1 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->m_motors,(key_type *)__k);
    std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,
               (__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> *)
               ((pmVar1->super___shared_ptr<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr + 0x250));
    std::static_pointer_cast<chrono::ChFunction_Setpoint,chrono::ChFunction>(&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = vals->_M_elems[lVar2];
    auVar3._8_8_ = 0x8000000000000000;
    auVar3._0_8_ = 0x8000000000000000;
    auVar3 = vxorpd_avx512vl(auVar4,auVar3);
    (**(code **)(*(long *)local_50.
                          super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                + 0xd0))(auVar3._0_8_,time);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_50.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    __k = (undefined1 *)((long)__k + 0x20);
  }
  return;
}

Assistant:

void RS_Limb::Activate(double time, const std::array<double, 8>& vals) {
    for (int i = 0; i < 8; i++) {
        auto fun = std::static_pointer_cast<ChFunction_Setpoint>(m_motors[motor_names[i]]->GetMotorFunction());
        fun->SetSetpoint(-vals[i], time);
    }
}